

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_compressBlock_lazy_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  int *iEnd;
  undefined8 *puVar1;
  ZSTD_matchState_t *pZVar2;
  undefined8 uVar3;
  long lVar4;
  seqStore_t *psVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  size_t sVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  int *mEnd;
  BYTE *pBVar13;
  int iVar14;
  int *piVar15;
  int *piVar16;
  BYTE *pBVar17;
  ulong uVar18;
  ulong uVar19;
  int *piVar20;
  long lVar21;
  seqDef *psVar22;
  size_t ofbCandidate;
  uint local_ec;
  uint local_e4;
  size_t local_d8;
  ulong local_d0;
  ZSTD_matchState_t *local_c8;
  BYTE *local_c0;
  int *local_b8;
  int *local_b0;
  BYTE *local_a8;
  BYTE *local_a0;
  uint local_94;
  BYTE *local_90;
  int *local_88;
  uint *local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  BYTE *local_60;
  seqStore_t *local_58;
  int *local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_c0 = (ms->window).base;
  uVar8 = (ms->window).dictLimit;
  local_d0 = (ulong)uVar8;
  uVar6 = (ms->cParams).minMatch;
  uVar7 = 6;
  if (uVar6 < 6) {
    uVar7 = uVar6;
  }
  uVar6 = 4;
  if (4 < uVar7) {
    uVar6 = uVar7;
  }
  local_a8 = local_c0 + local_d0;
  local_ec = *rep;
  pZVar2 = ms->dictMatchState;
  local_b0 = (int *)(pZVar2->window).nextSrc;
  local_a0 = (pZVar2->window).base;
  local_60 = local_a0 + (pZVar2->window).dictLimit;
  iVar14 = (int)local_b0;
  uVar7 = ((int)src - ((int)local_a8 + (int)local_60)) + iVar14;
  piVar15 = (int *)((long)src + (ulong)(uVar7 == 0));
  if (uVar7 < local_ec) {
    __assert_fail("offset_1 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x7977,
                  "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                 );
  }
  local_e4 = rep[1];
  if (uVar7 < local_e4) {
    __assert_fail("offset_2 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x7978,
                  "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                 );
  }
  iEnd = (int *)(srcSize + (long)src);
  local_b8 = (int *)((long)src + (srcSize - 8));
  ms->lazySkipping = 0;
  if (piVar15 < local_b8) {
    local_94 = ((int)local_a0 - iVar14) + uVar8;
    local_90 = local_a0 + -(ulong)local_94;
    local_88 = iEnd + -8;
    iVar12 = (int)local_c0;
    local_68 = (ulong)((1 - uVar8) - iVar12);
    local_70 = (ulong)(uint)-iVar12;
    local_78 = (ulong)((((iVar14 - uVar8) - (int)local_a0) - iVar12) + 1);
    local_c8 = ms;
    local_80 = rep;
    local_58 = seqStore;
    do {
      iVar14 = (int)piVar15;
      uVar8 = ((iVar14 - (int)local_c0) - local_ec) + 1;
      piVar16 = (int *)(local_c0 + uVar8);
      if (uVar8 < (uint)local_d0) {
        piVar16 = (int *)(local_a0 + (uVar8 - local_94));
      }
      if ((uVar8 - (uint)local_d0 < 0xfffffffd) && (*piVar16 == *(int *)((long)piVar15 + 1))) {
        piVar20 = iEnd;
        if (uVar8 < (uint)local_d0) {
          piVar20 = local_b0;
        }
        sVar9 = ZSTD_count_2segments
                          ((BYTE *)((long)piVar15 + 5),(BYTE *)(piVar16 + 1),(BYTE *)iEnd,
                           (BYTE *)piVar20,local_a8);
        uVar19 = sVar9 + 4;
      }
      else {
        uVar19 = 0;
      }
      pZVar2 = local_c8;
      local_d8 = 999999999;
      if (uVar6 == 6) {
        uVar10 = ZSTD_HcFindBestMatch_dictMatchState_6
                           (local_c8,(BYTE *)piVar15,(BYTE *)iEnd,&local_d8);
      }
      else if (uVar6 == 5) {
        uVar10 = ZSTD_HcFindBestMatch_dictMatchState_5
                           (local_c8,(BYTE *)piVar15,(BYTE *)iEnd,&local_d8);
      }
      else {
        uVar10 = ZSTD_HcFindBestMatch_dictMatchState_4
                           (local_c8,(BYTE *)piVar15,(BYTE *)iEnd,&local_d8);
      }
      uVar11 = uVar19;
      if (uVar19 < uVar10) {
        uVar11 = uVar10;
      }
      if (uVar11 < 4) {
        pZVar2->lazySkipping = (uint)(0x7ff < (ulong)((long)piVar15 - (long)src));
        piVar15 = (int *)((long)piVar15 + ((ulong)((long)piVar15 - (long)src) >> 8) + 1);
      }
      else {
        piVar16 = piVar15;
        uVar18 = local_d8;
        if (uVar10 <= uVar19) {
          piVar16 = (int *)((long)piVar15 + 1);
          uVar18 = 1;
        }
        uVar19 = uVar11;
        if (piVar15 < local_b8) {
          local_38 = (ulong)(((int)local_68 + iVar14) - local_ec);
          local_40 = (ulong)(((int)local_70 + iVar14) - local_ec);
          local_48 = (ulong)(((int)local_78 + iVar14) - local_ec);
          lVar21 = 0;
          local_50 = piVar15;
          do {
            piVar20 = (int *)((long)local_50 + lVar21 + 1);
            iVar14 = (int)lVar21;
            uVar8 = (int)local_40 + iVar14 + 1;
            piVar15 = (int *)(local_c0 + uVar8);
            if (uVar8 < (uint)local_d0) {
              piVar15 = (int *)(local_a0 + (uint)((int)local_48 + iVar14));
            }
            uVar19 = uVar11;
            if (((uint)((int)local_38 + iVar14) < 0xfffffffd) && (*piVar15 == *piVar20)) {
              mEnd = iEnd;
              if (uVar8 < (uint)local_d0) {
                mEnd = local_b0;
              }
              sVar9 = ZSTD_count_2segments
                                ((BYTE *)((long)local_50 + lVar21 + 5),(BYTE *)(piVar15 + 1),
                                 (BYTE *)iEnd,(BYTE *)mEnd,local_a8);
              if (sVar9 < 0xfffffffffffffffc) {
                uVar8 = 0x1f;
                if ((uint)uVar18 != 0) {
                  for (; (uint)uVar18 >> uVar8 == 0; uVar8 = uVar8 - 1) {
                  }
                }
                if ((int)((uVar8 ^ 0x1f) + (int)uVar11 * 3 + -0x1e) < (int)(sVar9 + 4) * 3) {
                  uVar18 = 1;
                  piVar16 = piVar20;
                  uVar19 = sVar9 + 4;
                }
              }
            }
            local_d8 = 999999999;
            if (uVar6 == 6) {
              uVar11 = ZSTD_HcFindBestMatch_dictMatchState_6
                                 (local_c8,(BYTE *)piVar20,(BYTE *)iEnd,&local_d8);
            }
            else if (uVar6 == 5) {
              uVar11 = ZSTD_HcFindBestMatch_dictMatchState_5
                                 (local_c8,(BYTE *)piVar20,(BYTE *)iEnd,&local_d8);
            }
            else {
              uVar11 = ZSTD_HcFindBestMatch_dictMatchState_4
                                 (local_c8,(BYTE *)piVar20,(BYTE *)iEnd,&local_d8);
            }
            if (uVar11 < 4) goto LAB_0015ba75;
            uVar8 = 0x1f;
            if ((uint)uVar18 != 0) {
              for (; (uint)uVar18 >> uVar8 == 0; uVar8 = uVar8 - 1) {
              }
            }
            iVar14 = 0x1f;
            if ((uint)local_d8 != 0) {
              for (; (uint)local_d8 >> iVar14 == 0; iVar14 = iVar14 + -1) {
              }
            }
            if ((int)uVar11 * 4 - iVar14 <= (int)((uVar8 ^ 0x1f) + (int)uVar19 * 4 + -0x1b))
            goto LAB_0015ba75;
            lVar4 = lVar21 + 1;
            lVar21 = lVar21 + 1;
            uVar18 = local_d8;
            piVar16 = piVar20;
          } while ((int *)((long)local_50 + lVar4) < local_b8);
          piVar16 = (int *)((long)local_50 + lVar21);
          uVar19 = uVar11;
        }
LAB_0015ba75:
        psVar5 = local_58;
        if (3 < uVar18) {
          uVar10 = (long)piVar16 + (-(long)local_c0 - uVar18) + -0xfffffffd;
          pBVar13 = local_c0;
          pBVar17 = local_a8;
          if ((uint)uVar10 < (uint)local_d0) {
            pBVar13 = local_90;
            pBVar17 = local_60;
          }
          if ((src < piVar16) && (uVar10 = uVar10 & 0xffffffff, pBVar17 < pBVar13 + uVar10)) {
            pBVar13 = pBVar13 + uVar10;
            do {
              piVar15 = (int *)((long)piVar16 + -1);
              pBVar13 = pBVar13 + -1;
              if ((*(BYTE *)piVar15 != *pBVar13) ||
                 (uVar19 = uVar19 + 1, piVar16 = piVar15, piVar15 <= src)) break;
            } while (pBVar17 < pBVar13);
          }
          local_e4 = local_ec;
          local_ec = (U32)uVar18 - 3;
        }
        if (local_58->maxNbSeq <=
            (ulong)((long)local_58->sequences - (long)local_58->sequencesStart >> 3)) {
LAB_0015be71:
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468b,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < local_58->maxNbLit) {
LAB_0015be52:
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468d,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        uVar10 = (long)piVar16 - (long)src;
        pBVar17 = local_58->lit;
        if (local_58->litStart + local_58->maxNbLit < pBVar17 + uVar10) {
LAB_0015be90:
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468e,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (iEnd < piVar16) {
LAB_0015beaf:
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468f,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_88 < piVar16) {
          ZSTD_safecopyLiterals(pBVar17,(BYTE *)src,(BYTE *)piVar16,(BYTE *)local_88);
LAB_0015bb82:
          psVar5->lit = psVar5->lit + uVar10;
          if (0xffff < uVar10) {
            if (psVar5->longLengthType != ZSTD_llt_none) {
              __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x46a0,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            psVar5->longLengthType = ZSTD_llt_literalLength;
            psVar5->longLengthPos =
                 (U32)((ulong)((long)psVar5->sequences - (long)psVar5->sequencesStart) >> 3);
          }
        }
        else {
          uVar3 = *(undefined8 *)((long)src + 8);
          *(undefined8 *)pBVar17 = *src;
          *(undefined8 *)(pBVar17 + 8) = uVar3;
          pBVar17 = local_58->lit;
          if (0x10 < uVar10) {
            if ((BYTE *)0xffffffffffffffe0 < pBVar17 + 0x10 + (-0x10 - ((long)src + 0x10))) {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x36a6,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            uVar3 = *(undefined8 *)((long)src + 0x18);
            *(undefined8 *)(pBVar17 + 0x10) = *(undefined8 *)((long)src + 0x10);
            *(undefined8 *)(pBVar17 + 0x18) = uVar3;
            if (0x20 < (long)uVar10) {
              lVar21 = 0;
              do {
                puVar1 = (undefined8 *)((long)src + lVar21 + 0x20);
                uVar3 = puVar1[1];
                pBVar13 = pBVar17 + lVar21 + 0x20;
                *(undefined8 *)pBVar13 = *puVar1;
                *(undefined8 *)(pBVar13 + 8) = uVar3;
                puVar1 = (undefined8 *)((long)src + lVar21 + 0x30);
                uVar3 = puVar1[1];
                *(undefined8 *)(pBVar13 + 0x10) = *puVar1;
                *(undefined8 *)(pBVar13 + 0x18) = uVar3;
                lVar21 = lVar21 + 0x20;
              } while (pBVar13 + 0x20 < pBVar17 + uVar10);
            }
            goto LAB_0015bb82;
          }
          local_58->lit = pBVar17 + uVar10;
        }
        psVar22 = psVar5->sequences;
        psVar22->litLength = (U16)uVar10;
        psVar22->offBase = (U32)uVar18;
        if (uVar19 < 3) {
LAB_0015be33:
          __assert_fail("matchLength >= MINMATCH",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x46aa,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0xffff < uVar19 - 3) {
          if (psVar5->longLengthType != ZSTD_llt_none) {
LAB_0015bece:
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x46ad,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          psVar5->longLengthType = ZSTD_llt_matchLength;
          psVar5->longLengthPos = (U32)((ulong)((long)psVar22 - (long)psVar5->sequencesStart) >> 3);
        }
        psVar22->mlBase = (U16)(uVar19 - 3);
        psVar22 = psVar22 + 1;
        psVar5->sequences = psVar22;
        if (local_c8->lazySkipping != 0) {
          local_c8->lazySkipping = 0;
        }
        src = (void *)((long)piVar16 + uVar19);
        piVar15 = (int *)src;
        if (src <= local_b8) {
          do {
            uVar7 = local_e4;
            uVar8 = ((int)src - (int)local_c0) - uVar7;
            pBVar17 = local_c0;
            if (uVar8 < (uint)local_d0) {
              pBVar17 = local_90;
            }
            piVar15 = (int *)src;
            local_e4 = uVar7;
            if ((0xfffffffc < uVar8 - (uint)local_d0) || (*(int *)(pBVar17 + uVar8) != *src)) break;
            piVar15 = iEnd;
            if (uVar8 < (uint)local_d0) {
              piVar15 = local_b0;
            }
            sVar9 = ZSTD_count_2segments
                              ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar17 + uVar8) + 4),
                               (BYTE *)iEnd,(BYTE *)piVar15,local_a8);
            if (psVar5->maxNbSeq <= (ulong)((long)psVar22 - (long)psVar5->sequencesStart >> 3))
            goto LAB_0015be71;
            if (0x20000 < psVar5->maxNbLit) goto LAB_0015be52;
            pBVar17 = psVar5->lit;
            if (psVar5->litStart + psVar5->maxNbLit < pBVar17) goto LAB_0015be90;
            if (iEnd < src) goto LAB_0015beaf;
            if (local_88 < src) {
              ZSTD_safecopyLiterals(pBVar17,(BYTE *)src,(BYTE *)src,(BYTE *)local_88);
            }
            else {
              uVar3 = *(undefined8 *)((long)src + 8);
              *(undefined8 *)pBVar17 = *src;
              *(undefined8 *)(pBVar17 + 8) = uVar3;
            }
            psVar22 = psVar5->sequences;
            psVar22->litLength = 0;
            psVar22->offBase = 1;
            if (sVar9 + 4 < 3) goto LAB_0015be33;
            if (0xffff < sVar9 + 1) {
              if (psVar5->longLengthType != ZSTD_llt_none) goto LAB_0015bece;
              psVar5->longLengthType = ZSTD_llt_matchLength;
              psVar5->longLengthPos =
                   (U32)((ulong)((long)psVar22 - (long)psVar5->sequencesStart) >> 3);
            }
            psVar22->mlBase = (U16)(sVar9 + 1);
            psVar22 = psVar22 + 1;
            psVar5->sequences = psVar22;
            src = (void *)((long)src + sVar9 + 4);
            piVar15 = (int *)src;
            local_e4 = local_ec;
            local_ec = uVar7;
          } while (src <= local_b8);
        }
      }
      rep = local_80;
    } while (piVar15 < local_b8);
  }
  *rep = local_ec;
  rep[1] = local_e4;
  return (long)iEnd - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_lazy_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_hashChain, 1, ZSTD_dictMatchState);
}